

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

char * lua_setupvalue(lua_State *L,int funcindex,int n)

{
  StkId pTVar1;
  GCObject *v;
  int iVar2;
  undefined4 uVar3;
  TValue *fi;
  char *pcVar4;
  UpVal *uv;
  CClosure *owner;
  TValue *val;
  UpVal *local_40;
  CClosure *local_38;
  TValue *local_30;
  
  local_30 = (TValue *)0x0;
  local_38 = (CClosure *)0x0;
  local_40 = (UpVal *)0x0;
  fi = index2addr(L,funcindex);
  pcVar4 = aux_upvalue(fi,n,&local_30,&local_38,&local_40);
  if (pcVar4 != (char *)0x0) {
    pTVar1 = L->top;
    L->top = pTVar1 + -1;
    iVar2 = pTVar1[-1].tt_;
    uVar3 = *(undefined4 *)&pTVar1[-1].field_0xc;
    local_30->value_ = pTVar1[-1].value_;
    local_30->tt_ = iVar2;
    *(undefined4 *)&local_30->field_0xc = uVar3;
    if (local_38 == (CClosure *)0x0) {
      if ((local_40 != (UpVal *)0x0) &&
         ((local_40->v == (TValue *)&local_40->u & (byte)local_40->v->tt_ >> 6) == 1)) {
        luaC_upvalbarrier_(L,local_40);
      }
    }
    else if ((((L->top->tt_ & 0x40) != 0) && ((local_38->marked & 4) != 0)) &&
            (v = (L->top->value_).gc, (v->marked & 3) != 0)) {
      luaC_barrier_(L,(GCObject *)local_38,v);
    }
  }
  return pcVar4;
}

Assistant:

LUA_API const char *lua_setupvalue (lua_State *L, int funcindex, int n) {
  const char *name;
  TValue *val = NULL;  /* to avoid warnings */
  CClosure *owner = NULL;
  UpVal *uv = NULL;
  StkId fi;
  lua_lock(L);
  fi = index2addr(L, funcindex);
  api_checknelems(L, 1);
  name = aux_upvalue(fi, n, &val, &owner, &uv);
  if (name) {
    L->top--;
    setobj(L, val, L->top);
    if (owner) { luaC_barrier(L, owner, L->top); }
    else if (uv) { luaC_upvalbarrier(L, uv); }
  }
  lua_unlock(L);
  return name;
}